

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall
wasm::FunctionValidator::visitCallIndirect(FunctionValidator *this,CallIndirect *curr)

{
  bool result;
  Table *pTVar1;
  
  validateReturnCall<wasm::CallIndirect>(this,curr);
  shouldBeEqualOrFirstIsUnreachable<wasm::CallIndirect*,wasm::Type>
            (this,(Type)(curr->target->type).id,(Type)0x2,curr,"indirect call target must be an i32"
            );
  if ((curr->target->type).id != 1) {
    pTVar1 = Module::getTableOrNull
                       ((this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .currModule,(Name)(curr->table).super_IString.str);
    shouldBeTrue<wasm::CallIndirect*>
              (this,pTVar1 != (Table *)0x0,curr,"call-indirect table must exist");
    if (pTVar1 != (Table *)0x0) {
      result = wasm::Type::isFunction(&pTVar1->type);
      shouldBeTrue<wasm::CallIndirect*>
                (this,result,curr,"call-indirect table must be of function type.");
    }
  }
  validateCallParamsAndResult<wasm::CallIndirect>(this,curr,(HeapType)(curr->heapType).id);
  return;
}

Assistant:

void FunctionValidator::visitCallIndirect(CallIndirect* curr) {
  validateReturnCall(curr);
  shouldBeEqualOrFirstIsUnreachable(curr->target->type,
                                    Type(Type::i32),
                                    curr,
                                    "indirect call target must be an i32");

  if (curr->target->type != Type::unreachable) {
    auto* table = getModule()->getTableOrNull(curr->table);
    shouldBeTrue(!!table, curr, "call-indirect table must exist");
    if (table) {
      shouldBeTrue(table->type.isFunction(),
                   curr,
                   "call-indirect table must be of function type.");
    }
  }

  validateCallParamsAndResult(curr, curr->heapType);
}